

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_window_title.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ALLEGRO_EVENT event;
  _Bool redraw;
  _Bool done;
  char title [256];
  char *text;
  int step;
  ALLEGRO_FONT *font;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_TIMER *timer;
  ALLEGRO_DISPLAY *display;
  int local_198;
  int local_178;
  char local_148 [40];
  char *local_40;
  uint local_34;
  
  local_34 = 0;
  memset(local_148,0,0x100);
  bVar1 = 0;
  bVar2 = true;
  uVar3 = al_install_system(0x5020700,atexit);
  if ((uVar3 & 1) == 0) {
    abort_example("Failed to init Allegro.\n");
  }
  uVar3 = al_init_image_addon();
  if ((uVar3 & 1) == 0) {
    abort_example("Failed to init IIO addon.\n");
  }
  al_init_font_addon();
  init_platform_specific();
  al_set_new_window_title("A Custom Window Title. Press space to start changing it.");
  lVar4 = al_create_display(0x280,0x1e0);
  if (lVar4 == 0) {
    abort_example("Error creating display.\n");
  }
  uVar3 = al_install_keyboard();
  if ((uVar3 & 1) == 0) {
    abort_example("Error installing keyboard.\n");
  }
  lVar5 = al_load_font("data/fixed_font.tga",0);
  if (lVar5 == 0) {
    abort_example("Error loading data/fixed_font.tga\n");
  }
  local_40 = (char *)al_get_new_window_title();
  uVar6 = al_create_timer(0x3ff0000000000000);
  uVar7 = al_create_event_queue();
  uVar8 = al_get_keyboard_event_source();
  al_register_event_source(uVar7,uVar8);
  uVar8 = al_get_timer_event_source(uVar6);
  al_register_event_source(uVar7,uVar8);
  uVar8 = al_get_display_event_source(lVar4);
  al_register_event_source(uVar7,uVar8);
  while ((bool)(bVar1 ^ 1)) {
    if ((bVar2) && (uVar3 = al_is_event_queue_empty(uVar7), (uVar3 & 1) != 0)) {
      uVar9 = 0;
      uVar8 = al_map_rgb_f(0);
      al_clear_to_color(uVar8,uVar9);
      uVar9 = 0x3f800000;
      uVar8 = al_map_rgba_f(0x3f800000);
      al_draw_text(uVar8,uVar9,lVar5,0,local_40);
      al_flip_display();
      bVar2 = false;
    }
    al_wait_for_event(uVar7);
    if (local_198 == 10) {
      if (local_178 == 0x3b) {
        bVar1 = 1;
      }
      else if (local_178 == 0x4b) {
        al_start_timer(uVar6);
      }
    }
    else if (local_198 == 0x1e) {
      bVar2 = true;
      local_34 = local_34 + 1;
      sprintf(local_148,"Title: %d",(ulong)local_34);
      local_40 = local_148;
      al_set_window_title(lVar4);
    }
    else if (local_198 == 0x2a) {
      bVar1 = 1;
    }
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_FONT *font;
   int step = 0;
   const char *text;
   char   title[TITLE_SIZE] = "";
   bool done = false;
   bool redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   if (!al_init_image_addon()) {
      abort_example("Failed to init IIO addon.\n");
   }

   al_init_font_addon();
   init_platform_specific();

   text = NEW_WINDOW_TITLE;

   al_set_new_window_title(NEW_WINDOW_TITLE);

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   font = al_load_font("data/fixed_font.tga", 0, 0);
   if (!font) {
      abort_example("Error loading data/fixed_font.tga\n");
   }

   text = al_get_new_window_title();

   timer = al_create_timer(INTERVAL);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_register_event_source(queue, al_get_display_event_source(display));



   while (!done) {
      ALLEGRO_EVENT event;

      if (redraw && al_is_event_queue_empty(queue)) {
         al_clear_to_color(al_map_rgb_f(0, 0, 0));
         al_draw_text(font, al_map_rgba_f(1, 1, 1, 0.5), 0, 0, 0, text);
         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_DOWN:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
               done = true;
            else if (event.keyboard.keycode == ALLEGRO_KEY_SPACE)
               al_start_timer(timer);
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            done = true;
            break;

         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            step++;
            sprintf(title, "Title: %d", step);
            text = title;
            al_set_window_title(display, title);
            break;
      }
   }

   return 0;
}